

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_eventfd_(uint initval,int flags)

{
  int iVar1;
  int r;
  int flags_local;
  uint initval_local;
  
  flags_local = eventfd(initval,flags);
  if (((flags_local < 0) && (flags != 0)) && (flags_local = eventfd(initval,0), -1 < flags_local)) {
    if (((flags & 0x80000U) == 0) ||
       (iVar1 = evutil_fast_socket_closeonexec(flags_local), -1 < iVar1)) {
      if (((flags & 0x800U) != 0) &&
         (iVar1 = evutil_fast_socket_nonblocking(flags_local), iVar1 < 0)) {
        evutil_closesocket(flags_local);
        flags_local = -1;
      }
    }
    else {
      evutil_closesocket(flags_local);
      flags_local = -1;
    }
  }
  return flags_local;
}

Assistant:

evutil_socket_t
evutil_eventfd_(unsigned initval, int flags)
{
#if defined(EVENT__HAVE_EVENTFD) && defined(EVENT__HAVE_SYS_EVENTFD_H)
	int r;
#if defined(EFD_CLOEXEC) && defined(EFD_NONBLOCK)
	r = eventfd(initval, flags);
	if (r >= 0 || flags == 0)
		return r;
#endif
	r = eventfd(initval, 0);
	if (r < 0)
		return r;
	if (flags & EVUTIL_EFD_CLOEXEC) {
		if (evutil_fast_socket_closeonexec(r) < 0) {
			evutil_closesocket(r);
			return -1;
		}
	}
	if (flags & EVUTIL_EFD_NONBLOCK) {
		if (evutil_fast_socket_nonblocking(r) < 0) {
			evutil_closesocket(r);
			return -1;
		}
	}
	return r;
#else
	return -1;
#endif
}